

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O1

string * __thiscall
gmlc::utilities::stringOps::getTailString_any_abi_cxx11_
          (string *__return_storage_ptr__,stringOps *this,string_view input,string_view sep)

{
  stringOps *psVar1;
  stringOps *psVar2;
  stringOps *psVar3;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_str = (char *)input._M_len;
  local_18._M_len = (size_t)this;
  psVar1 = (stringOps *)
           std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                     (&local_18,(char *)sep._M_len,0xffffffffffffffff,(size_type)input._M_str);
  psVar2 = (stringOps *)local_18._M_len;
  psVar3 = (stringOps *)local_18._M_str;
  if (psVar1 != (stringOps *)0xffffffffffffffff) {
    if (local_18._M_len <= psVar1) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
    }
    psVar2 = (stringOps *)(local_18._M_len + -(long)(psVar1 + 1));
    psVar3 = psVar1 + 1 + (long)local_18._M_str;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,psVar3,psVar2 + (long)psVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string
        getTailString_any(std::string_view input, std::string_view sep) noexcept
    {
        auto sepLoc = input.find_last_of(sep);
        auto ret = std::string(
            (sepLoc == std::string::npos) ? input : input.substr(sepLoc + 1));
        return ret;
    }